

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_access_block_segment_ptr(Integer g_a,Integer proc,void *ptr,Integer *len)

{
  int iVar1;
  char *pcVar2;
  Integer IVar3;
  long lVar4;
  
  iVar1 = GA[g_a + 1000].p_handle;
  if (-1 < proc) {
    IVar3 = pnga_pgroup_nnodes((long)iVar1);
    if (proc < IVar3) goto LAB_0016d43c;
  }
  pnga_error("processor index outside allowed values",proc);
LAB_0016d43c:
  lVar4 = g_a + 1000;
  IVar3 = pnga_pgroup_nodeid((long)iVar1);
  if (IVar3 != proc) {
    pnga_error("Only get accurate number of elements for processor making request",0);
  }
  pcVar2 = GA[lVar4].ptr[proc];
  *len = GA[lVar4].size / (long)GA[lVar4].elemsize;
  *(char **)ptr = pcVar2;
  return;
}

Assistant:

void pnga_access_block_segment_ptr(Integer g_a, Integer proc, void* ptr, Integer *len)
            /* g_a:  array handle [input]
             * proc: processor for data [input]
             * ptr:  pointer to data start of data on processor [output]
             * len:  length of data contained on processor [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  /*Integer  p_handle, nblocks;*/
  Integer /*ndim,*/ index;
  int grp = GA[handle].p_handle;

  
  /*p_handle = GA[handle].p_handle;*/
  /*nblocks = GA[handle].block_total;*/
  /*ndim = GA[handle].ndim;*/
  index = proc;
  if (index < 0 || index >= pnga_pgroup_nnodes(grp))
    pnga_error("processor index outside allowed values",index);

  if (index != pnga_pgroup_nodeid(grp))
    pnga_error("Only get accurate number of elements for processor making request",0);
  lptr = GA[handle].ptr[index];

  *len = GA[handle].size/GA[handle].elemsize;
  *(char**)ptr = lptr; 
}